

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

iterator * __thiscall Catch::clara::TextFlow::Column::iterator::operator++(iterator *this)

{
  char cVar1;
  pointer pbVar2;
  iterator *piVar3;
  ulong uVar4;
  void *pvVar5;
  pointer pbVar6;
  iterator *this_00;
  
  uVar4 = this->m_pos + this->m_len;
  this->m_pos = uVar4;
  pbVar6 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar4 < *(size_type *)((long)(pbVar6 + this->m_stringIndex) + 8)) &&
     (*(char *)(*(long *)&pbVar6[this->m_stringIndex]._M_dataplus + uVar4) == '\n')) {
    this->m_pos = uVar4 + 1;
  }
  else {
    uVar4 = this->m_pos;
    pbVar6 = (this->m_column->m_strings).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < *(size_type *)((long)(pbVar6 + this->m_stringIndex) + 8)) {
      pbVar6 = pbVar6 + this->m_stringIndex;
      this_00 = this;
      do {
        cVar1 = *(char *)(*(long *)&pbVar6->_M_dataplus + uVar4);
        if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
          operator++(this_00);
        }
        piVar3 = isWhitespace(char)::chars_abi_cxx11_;
        if (((DAT_005bd250 == 0) ||
            (this_00 = isWhitespace(char)::chars_abi_cxx11_,
            pvVar5 = memchr(isWhitespace(char)::chars_abi_cxx11_,(int)cVar1,DAT_005bd250),
            pvVar5 == (void *)0x0)) || ((long)pvVar5 - (long)piVar3 == -1)) break;
        uVar4 = this->m_pos + 1;
        this->m_pos = uVar4;
        pbVar2 = (this->m_column->m_strings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar6 = pbVar2 + this->m_stringIndex;
      } while (uVar4 < *(size_type *)((long)(pbVar2 + this->m_stringIndex) + 8));
    }
  }
  pbVar6 = (this->m_column->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (this->m_pos == *(size_type *)((long)(pbVar6 + this->m_stringIndex) + 8)) {
    this->m_pos = 0;
    this->m_stringIndex = this->m_stringIndex + 1;
  }
  if (this->m_stringIndex <
      (ulong)((long)(this->m_column->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6 >> 5)) {
    calcLength(this);
  }
  return this;
}

Assistant:

auto operator++() -> iterator & {
            m_pos += m_len;
            if (m_pos < line().size() && line()[m_pos] == '\n')
              m_pos += 1;
            else
              while (m_pos < line().size() && isWhitespace(line()[m_pos]))
                ++m_pos;

            if (m_pos == line().size()) {
              m_pos = 0;
              ++m_stringIndex;
            }
            if (m_stringIndex < m_column.m_strings.size())
              calcLength();
            return *this;
          }